

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

boundaries *
nlohmann::detail::dtoa_impl::compute_boundaries<double>
          (boundaries *__return_storage_ptr__,double value)

{
  bool bVar1;
  unsigned_long uVar2;
  ulong f_;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  diyfp dVar4;
  diyfp dVar5;
  diyfp dVar6;
  diyfp w_minus;
  diyfp w_plus;
  diyfp m_minus;
  diyfp m_plus;
  undefined1 auStack_58 [7];
  bool lower_boundary_is_closer;
  diyfp v;
  bool is_denormal;
  uint64_t F;
  uint64_t E;
  uint64_t bits;
  uint64_t kHiddenBit;
  int kMinExp;
  int kBias;
  int kPrecision;
  double value_local;
  
  bVar1 = std::isfinite(value);
  if (!bVar1) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                  ,0x38ba,
                  "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
                 );
  }
  if (0.0 < value) {
    uVar2 = reinterpret_bits<unsigned_long,double>(value);
    f_ = uVar2 & 0xfffffffffffff;
    v._15_1_ = uVar2 >> 0x34 == 0;
    if ((bool)v._15_1_) {
      diyfp::diyfp((diyfp *)auStack_58,f_,-0x432);
    }
    else {
      diyfp::diyfp((diyfp *)auStack_58,f_ + 0x10000000000000,(uint)(uVar2 >> 0x34) - 0x433);
    }
    diyfp::diyfp((diyfp *)&m_minus.e,(long)_auStack_58 * 2 + 1,(uint)v.f - 1);
    if (f_ == 0 && 1 < uVar2 >> 0x34) {
      diyfp::diyfp((diyfp *)&w_plus.e,(long)_auStack_58 * 4 - 1,(uint)v.f - 2);
      uVar3 = extraout_RDX;
    }
    else {
      diyfp::diyfp((diyfp *)&w_plus.e,(long)_auStack_58 * 2 - 1,(uint)v.f - 1);
      uVar3 = extraout_RDX_00;
    }
    dVar4.f = m_plus.f & 0xffffffff;
    dVar4._8_8_ = uVar3;
    dVar4 = diyfp::normalize((diyfp *)m_minus._8_8_,dVar4);
    w_plus.f._0_4_ = dVar4.e;
    dVar5 = diyfp::normalize_to((diyfp *)&w_plus.e,(int)w_plus.f);
    dVar6._8_8_ = dVar5._8_8_;
    dVar6.f = (ulong)(uint)v.f;
    dVar6 = diyfp::normalize(_auStack_58,dVar6);
    (__return_storage_ptr__->w).f = dVar6.f;
    (__return_storage_ptr__->w).e = dVar6.e;
    (__return_storage_ptr__->minus).f = dVar5.f;
    (__return_storage_ptr__->minus).e = dVar5.e;
    (__return_storage_ptr__->plus).f = dVar4.f;
    (__return_storage_ptr__->plus).e = (int)w_plus.f;
    return __return_storage_ptr__;
  }
  __assert_fail("value > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/json/json.hpp"
                ,0x38bb,
                "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
               );
}

Assistant:

boundaries compute_boundaries(FloatType value)
            {
                JSON_ASSERT(std::isfinite(value));
                JSON_ASSERT(value > 0);

                // Convert the IEEE representation into a diyfp.
                //
                // If v is denormal:
                //      value = 0.F * 2^(1 - bias) = (          F) * 2^(1 - bias - (p-1))
                // If v is normalized:
                //      value = 1.F * 2^(E - bias) = (2^(p-1) + F) * 2^(E - bias - (p-1))

                static_assert(std::numeric_limits<FloatType>::is_iec559,
                    "internal error: dtoa_short requires an IEEE-754 floating-point implementation");

                constexpr int      kPrecision = std::numeric_limits<FloatType>::digits; // = p (includes the hidden bit)
                constexpr int      kBias = std::numeric_limits<FloatType>::max_exponent - 1 + (kPrecision - 1);
                constexpr int      kMinExp = 1 - kBias;
                constexpr std::uint64_t kHiddenBit = std::uint64_t{ 1 } << (kPrecision - 1); // = 2^(p-1)

                using bits_type = typename std::conditional<kPrecision == 24, std::uint32_t, std::uint64_t >::type;

                const std::uint64_t bits = reinterpret_bits<bits_type>(value);
                const std::uint64_t E = bits >> (kPrecision - 1);
                const std::uint64_t F = bits & (kHiddenBit - 1);

                const bool is_denormal = E == 0;
                const diyfp v = is_denormal
                    ? diyfp(F, kMinExp)
                    : diyfp(F + kHiddenBit, static_cast<int>(E) - kBias);

                // Compute the boundaries m- and m+ of the floating-point value
                // v = f * 2^e.
                //
                // Determine v- and v+, the floating-point predecessor and successor if v,
                // respectively.
                //
                //      v- = v - 2^e        if f != 2^(p-1) or e == e_min                (A)
                //         = v - 2^(e-1)    if f == 2^(p-1) and e > e_min                (B)
                //
                //      v+ = v + 2^e
                //
                // Let m- = (v- + v) / 2 and m+ = (v + v+) / 2. All real numbers _strictly_
                // between m- and m+ round to v, regardless of how the input rounding
                // algorithm breaks ties.
                //
                //      ---+-------------+-------------+-------------+-------------+---  (A)
                //         v-            m-            v             m+            v+
                //
                //      -----------------+------+------+-------------+-------------+---  (B)
                //                       v-     m-     v             m+            v+

                const bool lower_boundary_is_closer = F == 0 && E > 1;
                const diyfp m_plus = diyfp(2 * v.f + 1, v.e - 1);
                const diyfp m_minus = lower_boundary_is_closer
                    ? diyfp(4 * v.f - 1, v.e - 2)  // (B)
                    : diyfp(2 * v.f - 1, v.e - 1); // (A)

// Determine the normalized w+ = m+.
                const diyfp w_plus = diyfp::normalize(m_plus);

                // Determine w- = m- such that e_(w-) = e_(w+).
                const diyfp w_minus = diyfp::normalize_to(m_minus, w_plus.e);

                return { diyfp::normalize(v), w_minus, w_plus };
            }